

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDebug.cpp
# Opt level: O3

VkBool32 VulkanUtilities::anon_unknown_0::DebugReportCallback
                   (VkDebugReportFlagsEXT flags,VkDebugReportObjectTypeEXT objectType,
                   uint64_t object,size_t location,int32_t messageCode,char *pLayerPrefix,
                   char *pMessage,void *pUserData)

{
  size_t sVar1;
  char **Args;
  undefined1 uVar2;
  string _msg;
  stringstream debugMessage;
  long *local_1e8;
  long local_1d8 [2];
  string local_1c8;
  Diligent local_1a8 [8];
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  uVar2 = 2;
  if ((flags & 8) == 0) {
    uVar2 = (flags & 6) != 0;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Vulkan debug message",0x14);
  if (pLayerPrefix != (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_190," (",2);
    sVar1 = strlen(pLayerPrefix);
    std::__ostream_insert<char,std::char_traits<char>>(local_190,pLayerPrefix,sVar1);
    std::__ostream_insert<char,std::char_traits<char>>(local_190,")",1);
  }
  if (pMessage != (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_190,": ",2);
    sVar1 = strlen(pMessage);
    std::__ostream_insert<char,std::char_traits<char>>(local_190,pMessage,sVar1);
  }
  std::__cxx11::stringbuf::str();
  Diligent::FormatString<char_const*>(&local_1c8,local_1a8,Args);
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8,local_1d8[0] + 1);
  }
  if (Diligent::DebugMessageCallback != (undefined *)0x0) {
    (*(code *)Diligent::DebugMessageCallback)(uVar2,local_1c8._M_dataplus._M_p,0,0,0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return 0;
}

Assistant:

VkBool32 VKAPI_PTR DebugReportCallback(
    VkDebugReportFlagsEXT      flags,
    VkDebugReportObjectTypeEXT objectType,
    uint64_t                   object,       // the object where the issue was detected
    size_t                     location,     // a component (layer, driver, loader) defined value specifying the location of the trigger. This is an optional value.
    int32_t                    messageCode,  // is a layer-defined value indicating what test triggered this callback.
    const char*                pLayerPrefix, // a null-terminated string that is an abbreviation of the name of the component making the callback.
    const char*                pMessage,     // a null-terminated string detailing the trigger conditions.
    void*                      pUserData)
{
    auto MsgSeverity = DEBUG_MESSAGE_SEVERITY_INFO;
    if (flags & VK_DEBUG_REPORT_ERROR_BIT_EXT)
    {
        MsgSeverity = DEBUG_MESSAGE_SEVERITY_ERROR;
    }
    else if (flags & (VK_DEBUG_REPORT_WARNING_BIT_EXT | VK_DEBUG_REPORT_PERFORMANCE_WARNING_BIT_EXT))
    {
        MsgSeverity = DEBUG_MESSAGE_SEVERITY_WARNING;
    }
    else if (flags & (VK_DEBUG_REPORT_INFORMATION_BIT_EXT | VK_DEBUG_REPORT_DEBUG_BIT_EXT))
    {
        MsgSeverity = DEBUG_MESSAGE_SEVERITY_INFO;
    }

    std::stringstream debugMessage;
    debugMessage << "Vulkan debug message";
    if (pLayerPrefix != nullptr)
        debugMessage << " (" << pLayerPrefix << ")";

    if (pMessage != nullptr)
        debugMessage << ": " << pMessage;

    LOG_DEBUG_MESSAGE(MsgSeverity, debugMessage.str().c_str());

    // The callback returns a VkBool32, which is interpreted in a layer-specified manner.
    // The application should always return VK_FALSE. The VK_TRUE value is reserved for
    // use in layer development.
    return VK_FALSE;
}